

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O3

size_t __thiscall
ContextSpecificHolder<Boolean,_(unsigned_char)'\xa4',_(OptionType)0>::EncodedSize
          (ContextSpecificHolder<Boolean,_(unsigned_char)__xa4_,_(OptionType)0> *this)

{
  ulong uVar1;
  long lVar2;
  size_t sVar3;
  
  uVar1 = (this->innerType).super_DerBase.cbData;
  if (uVar1 == 0) {
    sVar3 = 0;
  }
  else {
    lVar2 = 2;
    if ((((0x7f < uVar1) && (lVar2 = 3, 0xff < uVar1)) && (lVar2 = 4, 0xffff < uVar1)) &&
       (((lVar2 = 5, 0xffffff < uVar1 && (lVar2 = 6, uVar1 >> 0x20 != 0)) &&
        (lVar2 = 7, uVar1 >> 0x28 != 0)))) {
      lVar2 = (ulong)(uVar1 >> 0x30 == 0) << 3;
    }
    sVar3 = lVar2 + uVar1;
  }
  return sVar3;
}

Assistant:

size_t EncodedSize() 
	{
		if (innerType.GetcbData() == 0)
			return 0;

		return innerType.EncodedSize(); 
	}